

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::VerifyLinkItemColons(cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  size_t *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *this_00;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  string *psVar7;
  long lVar8;
  cmake *this_01;
  PolicyID id;
  MessageType t;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string e;
  cmListFileBacktrace backtrace;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  _Alloc_hider local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  _Base_ptr local_50;
  char *local_48;
  _Base_ptr local_40;
  size_t local_38;
  
  bVar4 = true;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar7 = cmLinkItem::AsStr_abi_cxx11_(item);
    local_90._M_str = (psVar7->_M_dataplus)._M_p;
    local_90._M_len = psVar7->_M_string_length;
    __str._M_str = "<LINK_GROUP:";
    __str._M_len = 0xc;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_90,0,0xc,__str);
    if (iVar5 != 0) {
      psVar7 = cmLinkItem::AsStr_abi_cxx11_(item);
      lVar8 = std::__cxx11::string::find((char *)psVar7,0x6f6d8b,0);
      if (lVar8 != -1) {
        local_d0._8_8_ = 0;
        local_c0._M_local_buf[0] = '\0';
        local_d0._0_8_ = &local_c0;
        PVar6 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0028);
        if (PVar6 == OLD) {
          bVar4 = true;
        }
        else {
          t = FATAL_ERROR;
          if (PVar6 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_b0,(cmPolicies *)0x1c,id);
            local_90._M_len = local_b0._8_8_;
            local_90._M_str = (char *)local_b0._0_8_;
            local_80._M_p = &DAT_00000001;
            local_78 = "\n";
            views._M_len = 2;
            views._M_array = &local_90;
            cmCatViews_abi_cxx11_((string *)local_f8,views);
            std::__cxx11::string::operator=((string *)local_d0,(string *)local_f8);
            if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
              operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
            }
            if ((cmMakefile *)local_b0._0_8_ != (cmMakefile *)(local_b0 + 0x10)) {
              operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
            }
            t = AUTHOR_WARNING;
          }
          uVar3 = local_d0._8_8_;
          uVar2 = local_d0._0_8_;
          if (role == Implementation) {
            psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
            local_90._M_len = uVar3;
            local_90._M_str = (char *)uVar2;
            local_80._M_p = (pointer)0x8;
            local_78 = "Target \"";
            local_70._8_8_ = (psVar7->_M_dataplus)._M_p;
            local_70._M_allocated_capacity = psVar7->_M_string_length;
            local_60._0_8_ = 10;
            local_60._8_8_ = "\" links to";
            views_01._M_len = 4;
            views_01._M_array = &local_90;
            cmCatViews_abi_cxx11_((string *)local_f8,views_01);
          }
          else {
            psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
            local_90._M_len = uVar3;
            local_90._M_str = (char *)uVar2;
            local_80._M_p = &DAT_0000001e;
            local_78 = "The link interface of target \"";
            local_70._8_8_ = (psVar7->_M_dataplus)._M_p;
            local_70._M_allocated_capacity = psVar7->_M_string_length;
            local_60._0_8_ = 10;
            local_60._8_8_ = "\" contains";
            views_00._M_len = 4;
            views_00._M_array = &local_90;
            cmCatViews_abi_cxx11_((string *)local_f8,views_00);
          }
          std::__cxx11::string::operator=((string *)local_d0,(string *)local_f8);
          if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
          }
          uVar3 = local_d0._8_8_;
          uVar2 = local_d0._0_8_;
          psVar7 = cmLinkItem::AsStr_abi_cxx11_(item);
          local_90._M_len = uVar3;
          local_90._M_str = (char *)uVar2;
          local_80._M_p = (pointer)0x4;
          local_78 = ":\n  ";
          local_70._8_8_ = (psVar7->_M_dataplus)._M_p;
          local_70._M_allocated_capacity = psVar7->_M_string_length;
          local_60._0_8_ = 1;
          local_60._8_8_ = "\n";
          local_50 = (_Base_ptr)0x1f;
          local_40 = (_Base_ptr)0x9d;
          if (_ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_0 == '\0') {
            local_40 = (_Base_ptr)0x0;
          }
          local_48 = "but the target was not found.  ";
          local_38 = _ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_1;
          views_02._M_len = 6;
          views_02._M_array = &local_90;
          cmCatViews_abi_cxx11_((string *)local_f8,views_02);
          std::__cxx11::string::operator=((string *)local_d0,(string *)local_f8);
          if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
          }
          local_90._M_len =
               (size_t)(item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
          local_90._M_str =
               (char *)(item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
          if ((cmMakefile *)local_90._M_str != (cmMakefile *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              psVar1 = &(((cmMakefile *)local_90._M_str)->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map_size;
              *(int *)psVar1 = (int)*psVar1 + 1;
              UNLOCK();
            }
            else {
              psVar1 = &(((cmMakefile *)local_90._M_str)->FindPackageRootPathStack).
                        super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_map_size;
              *(int *)psVar1 = (int)*psVar1 + 1;
            }
          }
          bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_90);
          if (bVar4) {
            GetBacktrace((cmGeneratorTarget *)local_f8);
            this_00 = local_90._M_str;
            local_90._M_str = (char *)local_f8._8_8_;
            local_90._M_len = local_f8._0_8_;
            local_f8._0_8_ = (element_type *)0x0;
            local_f8._8_8_ = (cmMakefile *)0x0;
            if ((cmMakefile *)this_00 != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
            if ((cmMakefile *)local_f8._8_8_ != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
            }
          }
          this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          cmake::IssueMessage(this_01,t,(string *)local_d0,(cmListFileBacktrace *)&local_90);
          if ((cmMakefile *)local_90._M_str != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_str);
          }
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ != &local_c0) {
          operator_delete((void *)local_d0._0_8_,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemColons(LinkItemRole role,
                                             cmLinkItem const& item) const
{
  if (item.Target || cmHasPrefix(item.AsStr(), "<LINK_GROUP:"_s) ||
      item.AsStr().find("::") == std::string::npos) {
    return true;
  }
  MessageType messageType = MessageType::FATAL_ERROR;
  std::string e;
  switch (this->GetLocalGenerator()->GetPolicyStatus(cmPolicies::CMP0028)) {
    case cmPolicies::WARN: {
      e = cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0028), "\n");
      messageType = MessageType::AUTHOR_WARNING;
    } break;
    case cmPolicies::OLD:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Issue the fatal message.
      break;
  }

  if (role == LinkItemRole::Implementation) {
    e = cmStrCat(e, "Target \"", this->GetName(), "\" links to");
  } else {
    e = cmStrCat(e, "The link interface of target \"", this->GetName(),
                 "\" contains");
  }
  e =
    cmStrCat(e, ":\n  ", item.AsStr(), "\n", "but the target was not found.  ",
             missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(messageType, e,
                                                              backtrace);
  return false;
}